

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bar.cpp
# Opt level: O3

ScalarFunctionSet * duckdb::BarFun::GetFunctions(void)

{
  ScalarFunctionSet *in_RDI;
  long lVar1;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  allocator_type local_3b9;
  ScalarFunctionSet *local_3b8;
  code *local_3b0;
  undefined8 local_3a8;
  code *local_3a0;
  code *local_398;
  code *local_390;
  undefined8 local_388;
  code *local_380;
  code *local_378;
  LogicalType local_370 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_358;
  LogicalType local_340 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_328;
  LogicalType local_310 [24];
  LogicalType local_2f8 [24];
  LogicalType local_2e0 [24];
  LogicalType local_2c8 [24];
  LogicalType local_2b0 [24];
  LogicalType local_298 [24];
  ScalarFunction local_280;
  ScalarFunction local_158;
  
  duckdb::ScalarFunctionSet::ScalarFunctionSet(in_RDI);
  local_3b8 = in_RDI;
  duckdb::LogicalType::LogicalType(local_310,DOUBLE);
  duckdb::LogicalType::LogicalType(local_2f8,DOUBLE);
  duckdb::LogicalType::LogicalType(local_2e0,DOUBLE);
  duckdb::LogicalType::LogicalType(local_2c8,DOUBLE);
  __l._M_len = 4;
  __l._M_array = local_310;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_328,__l,&local_3b9);
  duckdb::LogicalType::LogicalType(local_340,VARCHAR);
  local_388 = 0;
  local_390 = BarFunction;
  local_378 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_invoke;
  local_380 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  duckdb::LogicalType::LogicalType(local_298,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            (&local_158,&local_328,local_340,&local_390,0,0,0,0,local_298,0,0,0);
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            ((vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *)
             (in_RDI + 0x20),&local_158);
  local_158._0_8_ = &PTR__ScalarFunction_008914d8;
  if (local_158.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_158.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_158.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_158.function.super__Function_base._M_manager)
              ((_Any_data *)((long)&local_158 + 0xb0U),(_Any_data *)((long)&local_158 + 0xb0U),
               __destroy_functor);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction(&local_158.super_BaseScalarFunction);
  duckdb::LogicalType::~LogicalType(local_298);
  if (local_380 != (code *)0x0) {
    (*local_380)(&local_390,&local_390,3);
  }
  duckdb::LogicalType::~LogicalType(local_340);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_328);
  lVar1 = 0x48;
  do {
    duckdb::LogicalType::~LogicalType(local_310 + lVar1);
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  duckdb::LogicalType::LogicalType(local_310,DOUBLE);
  duckdb::LogicalType::LogicalType(local_2f8,DOUBLE);
  duckdb::LogicalType::LogicalType(local_2e0,DOUBLE);
  __l_00._M_len = 3;
  __l_00._M_array = local_310;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_358,__l_00,&local_3b9);
  duckdb::LogicalType::LogicalType(local_370,VARCHAR);
  local_3a8 = 0;
  local_3b0 = BarFunction;
  local_398 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_invoke;
  local_3a0 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  duckdb::LogicalType::LogicalType(local_2b0,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            (&local_280,&local_358,local_370,&local_3b0,0,0,0,0,local_2b0,0,0,0);
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            ((vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *)
             (in_RDI + 0x20),&local_280);
  local_280._0_8_ = &PTR__ScalarFunction_008914d8;
  if (local_280.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_280.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_280.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_280.function.super__Function_base._M_manager)
              ((_Any_data *)((long)&local_280 + 0xb0U),(_Any_data *)((long)&local_280 + 0xb0U),
               __destroy_functor);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction(&local_280.super_BaseScalarFunction);
  duckdb::LogicalType::~LogicalType(local_2b0);
  if (local_3a0 != (code *)0x0) {
    (*local_3a0)(&local_3b0,&local_3b0,3);
  }
  duckdb::LogicalType::~LogicalType(local_370);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_358);
  lVar1 = 0x30;
  do {
    duckdb::LogicalType::~LogicalType(local_310 + lVar1);
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  return local_3b8;
}

Assistant:

ScalarFunctionSet BarFun::GetFunctions() {
	ScalarFunctionSet bar;
	bar.AddFunction(ScalarFunction({LogicalType::DOUBLE, LogicalType::DOUBLE, LogicalType::DOUBLE, LogicalType::DOUBLE},
	                               LogicalType::VARCHAR, BarFunction));
	bar.AddFunction(ScalarFunction({LogicalType::DOUBLE, LogicalType::DOUBLE, LogicalType::DOUBLE},
	                               LogicalType::VARCHAR, BarFunction));
	return bar;
}